

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

int coda_strnprintf(string *out,size_t pos,size_t num,char *fmt,...)

{
  char in_AL;
  int iVar1;
  char *pcVar2;
  char *in_RCX;
  ulong in_RDX;
  char *in_RSI;
  ulong in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *BUF_1;
  char BUF [32768];
  int bytes;
  va_list ap;
  undefined1 local_8118 [32];
  undefined8 local_80f8;
  undefined8 local_80f0;
  undefined8 local_80e8;
  undefined8 local_80d8;
  undefined8 local_80c8;
  undefined8 local_80b8;
  undefined8 local_80a8;
  undefined8 local_8098;
  undefined8 local_8088;
  undefined8 local_8078;
  char *local_8060;
  char local_8058 [32780];
  int local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined1 *local_40;
  undefined1 *local_38;
  char *local_28;
  ulong local_20;
  char *local_18;
  ulong local_10;
  int local_4;
  
  if (in_AL != '\0') {
    local_80e8 = in_XMM0_Qa;
    local_80d8 = in_XMM1_Qa;
    local_80c8 = in_XMM2_Qa;
    local_80b8 = in_XMM3_Qa;
    local_80a8 = in_XMM4_Qa;
    local_8098 = in_XMM5_Qa;
    local_8088 = in_XMM6_Qa;
    local_8078 = in_XMM7_Qa;
  }
  local_80f8 = in_R8;
  local_80f0 = in_R9;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  pcVar2 = (char *)std::__cxx11::string::size();
  if (pcVar2 < local_18) {
    local_4 = -1;
  }
  else {
    local_38 = local_8118;
    local_40 = &stack0x00000008;
    local_44 = 0x30;
    local_48 = 0x20;
    if (local_20 < 0x8000) {
      iVar1 = (int)local_20;
      local_4c = vsnprintf(local_8058,local_20 + 1,local_28,&local_48);
      if (iVar1 < local_4c) {
        local_4c = (int)local_20;
      }
      std::__cxx11::string::insert(local_10,local_18,(ulong)local_8058);
    }
    else {
      local_8060 = (char *)operator_new__(local_20 + 1);
      iVar1 = (int)local_20;
      local_4c = vsnprintf(local_8060,local_20 + 1,local_28,&local_48);
      if (iVar1 < local_4c) {
        local_4c = (int)local_20;
      }
      std::__cxx11::string::insert(local_10,local_18,(ulong)local_8060);
      if (local_8060 != (char *)0x0) {
        operator_delete__(local_8060);
      }
    }
    local_4 = local_4c;
  }
  return local_4;
}

Assistant:

int coda_strnprintf(std::string& out, size_t pos, size_t num, const char* fmt, ...)
{
	if (out.size() < pos) return -1;

	va_list ap;
	va_start(ap, fmt);

	int bytes;

	if (num < BUFSZ)
	{
		char BUF[BUFSZ];

		if ((int) num < (bytes = vsnprintf(BUF, num + 1, fmt, ap)))
		{
			bytes = num;
		}

		out.insert(pos, BUF, bytes);
	}
	else
	{
		char* BUF = new char [num + 1];

		if ((int) num < (bytes = vsnprintf(BUF, num + 1, fmt, ap)))
		{
			bytes = num;
		}

		out.insert(pos, BUF, bytes);

		delete [] BUF;
	}

	va_end(ap);

	return bytes;
}